

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

void BZ2_bzclose(BZFILE *b)

{
  FILE *__stream;
  int bzerr;
  
  if (b != (BZFILE *)0x0) {
    __stream = *b;
    if (*(char *)((long)b + 0x1394) == '\0') {
      BZ2_bzReadClose(&bzerr,b);
    }
    else {
      BZ2_bzWriteClose(&bzerr,b,0,(uint *)0x0,(uint *)0x0);
      if (bzerr != 0) {
        BZ2_bzWriteClose((int *)0x0,b,1,(uint *)0x0,(uint *)0x0);
      }
    }
    if ((__stream != _stdin) && (__stream != _stdout)) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void BZ2_bzclose (BZFILE* b)
{
   int bzerr;
   FILE *fp;
   
   if (b==NULL) {return;}
   fp = ((bzFile *)b)->handle;
   if(((bzFile*)b)->writing){
      BZ2_bzWriteClose(&bzerr,b,0,NULL,NULL);
      if(bzerr != BZ_OK){
         BZ2_bzWriteClose(NULL,b,1,NULL,NULL);
      }
   }else{
      BZ2_bzReadClose(&bzerr,b);
   }
   if(fp!=stdin && fp!=stdout){
      fclose(fp);
   }
}